

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void __thiscall ImGuiMenuColumns::Update(ImGuiMenuColumns *this,int count,float spacing,bool clear)

{
  byte in_DL;
  float *in_RDI;
  float in_XMM0_Da;
  int i;
  int local_18;
  
  in_RDI[2] = 0.0;
  in_RDI[1] = 0.0;
  *in_RDI = in_XMM0_Da;
  if ((in_DL & 1) != 0) {
    memset(in_RDI + 6,0,0xc);
  }
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    if ((0 < local_18) && (0.0 < in_RDI[(long)local_18 + 6])) {
      in_RDI[1] = *in_RDI + in_RDI[1];
    }
    in_RDI[(long)local_18 + 3] = (float)(int)in_RDI[1];
    in_RDI[1] = in_RDI[(long)local_18 + 6] + in_RDI[1];
    in_RDI[(long)local_18 + 6] = 0.0;
  }
  return;
}

Assistant:

void ImGuiMenuColumns::Update(int count, float spacing, bool clear)
{
    IM_ASSERT(count == IM_ARRAYSIZE(Pos));
    IM_UNUSED(count);
    Width = NextWidth = 0.0f;
    Spacing = spacing;
    if (clear)
        memset(NextWidths, 0, sizeof(NextWidths));
    for (int i = 0; i < IM_ARRAYSIZE(Pos); i++)
    {
        if (i > 0 && NextWidths[i] > 0.0f)
            Width += Spacing;
        Pos[i] = IM_FLOOR(Width);
        Width += NextWidths[i];
        NextWidths[i] = 0.0f;
    }
}